

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_customData
                   (string *__return_storage_ptr__,CustomDataType *customData,string *dict_name,
                   uint32_t indent)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  uint32_t n;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  _Rb_tree_node_base *p_Var5;
  undefined1 auVar6 [16];
  allocator local_229;
  pprint *local_228;
  string *local_220;
  string name;
  string local_1f8;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  local_220 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  pprint::Indent_abi_cxx11_(&name,(pprint *)(ulong)indent,n);
  ::std::operator<<(local_1a8,(string *)&name);
  ::std::__cxx11::string::_M_dispose();
  if (dict_name->_M_string_length == 0) {
    ::std::operator<<(local_1a8,"{\n");
    uVar4 = extraout_RDX_00;
  }
  else {
    ::std::__cxx11::string::string((string *)&name,(string *)dict_name);
    bVar2 = isValidIdentifier(&name,true);
    if (!bVar2) {
      ::std::__cxx11::string::string((string *)&local_1f8,"\"",&local_229);
      quote(&local_1d8,&name,&local_1f8);
      ::std::__cxx11::string::operator=((string *)&name,(string *)&local_1d8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    poVar3 = ::std::operator<<(local_1a8,(string *)&name);
    ::std::operator<<(poVar3," = {\n");
    ::std::__cxx11::string::_M_dispose();
    uVar4 = extraout_RDX;
  }
  auVar6._8_8_ = uVar4;
  auVar6._0_8_ = (customData->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_228 = (pprint *)(ulong)indent;
  while (p_Var5 = auVar6._0_8_,
        (_Rb_tree_header *)p_Var5 != &(customData->_M_t)._M_impl.super__Rb_tree_header) {
    print_meta(&name,(MetaVariable *)(p_Var5 + 2),indent + 1,true,(string *)(p_Var5 + 1));
    ::std::operator<<(local_1a8,(string *)&name);
    ::std::__cxx11::string::_M_dispose();
    auVar6 = ::std::_Rb_tree_increment(p_Var5);
  }
  pprint::Indent_abi_cxx11_(&name,local_228,auVar6._8_4_);
  poVar3 = ::std::operator<<(local_1a8,(string *)&name);
  ::std::operator<<(poVar3,"}\n");
  ::std::__cxx11::string::_M_dispose();
  psVar1 = local_220;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return psVar1;
}

Assistant:

std::string print_customData(const CustomDataType &customData,
                             const std::string &dict_name,
                             const uint32_t indent) {
  std::stringstream ss;

  ss << pprint::Indent(indent);
  if (!dict_name.empty()) {
    std::string name = dict_name;

    if (!isValidIdentifier(name)) {
      // May contain "/", quote it
      name = quote(name);
    }

    ss << name << " = {\n";
  } else {
    ss << "{\n";
  }
  for (const auto &item : customData) {
    ss << print_meta(item.second, indent + 1, true, item.first);
  }
  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}